

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Appearance_PDU::SetAppearanceEM(Appearance_PDU *this,EntityAppearance *EM)

{
  undefined2 uVar1;
  KUINT16 KVar2;
  
  if (((this->m_AppearanceFlag2Union).m_ui8Flag & 1) == 0) {
    (this->m_AppearanceFlag2Union).m_ui8Flag = (this->m_AppearanceFlag2Union).m_ui8Flag | 1;
    if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
      KVar2 = (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    }
    else {
      (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 0x80;
      uVar1 = (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
      KVar2 = uVar1 + 1;
    }
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar2 + 4;
  }
  (this->m_EMApp).m_Appearance = EM->m_Appearance;
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceEMFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag2Union.m_ui8EM )return;

    m_AppearanceFlag2Union.m_ui8EM = F;

    if( F )
    {
        SetFlag2Flag( F );
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}